

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

void __thiscall trieste::detail::Make::error(Make *this,string *msg,size_t index)

{
  bool bVar1;
  element_type *this_00;
  Location *pLVar2;
  string local_60;
  undefined1 local_40 [40];
  size_t index_local;
  string *msg_local;
  Make *this_local;
  
  local_40._32_8_ = index;
  index_local = (size_t)msg;
  msg_local = (string *)this;
  Token::Token((Token *)(local_40 + 0x18),(TokenDef *)Group);
  bVar1 = in(this,(Token *)(local_40 + 0x18));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    Token::Token((Token *)(local_40 + 0x10),(TokenDef *)Group);
    push(this,(Token *)(local_40 + 0x10),0);
  }
  this_00 = CLI::std::
            __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->node);
  pLVar2 = REMatch::at(&this->re_match,local_40._32_8_);
  Location::Location((Location *)&local_60,pLVar2);
  make_error((Make *)local_40,(Location *)this,&local_60);
  NodeDef::push_back(this_00,(Node *)local_40);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_40);
  Location::~Location((Location *)&local_60);
  return;
}

Assistant:

void error(const std::string& msg, size_t index = 0)
      {
        if (!in(Group))
          push(Group);

        node->push_back(make_error(re_match.at(index), msg));
      }